

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

void __thiscall
duckdb::MultiFileOptions::AutoDetectHiveTypesInternal
          (MultiFileOptions *this,MultiFileList *files,ClientContext *context)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  MultiFileList *file_list_p;
  LogicalType *target_type;
  __node_base _Var8;
  long lVar9;
  LogicalType detected_type;
  MultiFileListIterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  MultiFileListIterator __end1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  detected_types;
  Value value;
  LogicalType local_210;
  undefined1 local_1f8 [32];
  LogicalType local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  LogicalType local_1b8;
  LogicalType local_198;
  string local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  MultiFileListIterator local_130;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  LogicalType local_b8 [3];
  Value local_70;
  
  LogicalType::LogicalType(local_b8,DATE);
  LogicalType::LogicalType(local_b8 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_b8 + 2,BIGINT);
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  MultiFileListIterationHelper::MultiFileListIterationHelper
            ((MultiFileListIterationHelper *)local_1f8,files);
  file_list_p = (MultiFileList *)local_1f8._0_8_;
  iVar4 = (*(*(_func_int ***)local_1f8._0_8_)[5])(local_1f8._0_8_);
  if ((char)iVar4 == '\0') {
    file_list_p = (MultiFileList *)0x0;
  }
  MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
            ((MultiFileListIterator *)local_1f8,file_list_p);
  MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
            (&local_130,(MultiFileList *)0x0);
  while (((MultiFileList *)local_1f8._0_8_ != local_130.file_list.ptr ||
         (local_1f8._8_8_ != local_130.file_scan_data.current_file_idx))) {
    HivePartitioning::Parse
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_160,(string *)(local_1f8 + 0x10));
    p_Var7 = local_160._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_160._M_impl.super__Rb_tree_header._M_node_count == 0) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_160);
      if (local_130.current_file.extended_info.internal.
          super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_130.current_file.extended_info.internal.
                   super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.current_file.path._M_dataplus._M_p != &local_130.current_file.path.field_2) {
        operator_delete(local_130.current_file.path._M_dataplus._M_p);
      }
      if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
      }
      if ((LogicalType *)local_1f8._16_8_ != &local_1d8) {
        operator_delete((void *)local_1f8._16_8_);
      }
LAB_0123952c:
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f0);
      lVar9 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_b8[0].id_ + lVar9));
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != -0x18);
      return;
    }
    for (; (_Rb_tree_header *)p_Var7 != &local_160._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7)) {
      iVar5 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->hive_types_schema)._M_h,(key_type *)(p_Var7 + 1));
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ._M_cur == (__node_type *)0x0) {
        LogicalType::LogicalType(&local_210,VARCHAR);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,*(long *)(p_Var7 + 2),
                   (long)&(p_Var7[2]._M_parent)->_M_color + *(long *)(p_Var7 + 2));
        Value::Value(&local_70,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        lVar9 = 0x48;
        target_type = local_b8;
        do {
          bVar3 = Value::TryCastAs(&local_70,context,target_type,true);
          if (bVar3) {
            if (target_type != &local_210) {
              local_210.id_ = target_type->id_;
              local_210.physical_type_ = target_type->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&local_210.type_info_,&target_type->type_info_);
            }
            break;
          }
          target_type = target_type + 1;
          lVar9 = lVar9 + -0x18;
        } while (lVar9 != 0);
        iVar6 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_f0,(key_type *)(p_Var7 + 1));
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_1b8._0_8_ =
               &local_1b8.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,*(long *)(p_Var7 + 1),
                     (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
          LogicalType::LogicalType(&local_198,&local_210);
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&local_f0,(string *)&local_1b8);
          LogicalType::~LogicalType(&local_198);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b8._0_8_ !=
              &local_1b8.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)local_1b8._0_8_);
          }
        }
        else {
          bVar3 = LogicalType::operator==
                            ((LogicalType *)
                             ((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                    ._M_cur + 0x28),&local_210);
          if (!bVar3) {
            LogicalType::LogicalType(&local_1b8,VARCHAR);
            *(LogicalTypeId *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x28) = local_1b8.id_;
            *(PhysicalType *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x29) = local_1b8.physical_type_;
            peVar1 = *(element_type **)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             ._M_cur + 0x30);
            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             ._M_cur + 0x38);
            *(element_type **)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x30) =
                 local_1b8.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x38) =
                 local_1b8.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            local_1b8.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
            local_1b8.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var2;
            LogicalType::~LogicalType(&local_1b8);
          }
        }
        Value::~Value(&local_70);
        LogicalType::~LogicalType(&local_210);
      }
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_160);
    MultiFileListIterationHelper::MultiFileListIterator::Next((MultiFileListIterator *)local_1f8);
  }
  if (local_130.current_file.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.current_file.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.current_file.path._M_dataplus._M_p != &local_130.current_file.path.field_2) {
    operator_delete(local_130.current_file.path._M_dataplus._M_p);
  }
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  if ((LogicalType *)local_1f8._16_8_ != &local_1d8) {
    operator_delete((void *)local_1f8._16_8_);
  }
  if (local_f0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_f0._M_before_begin._M_nxt;
    do {
      local_1f8._0_8_ = (MultiFileList *)(local_1f8 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,_Var8._M_nxt[1]._M_nxt,
                 (long)&(_Var8._M_nxt[2]._M_nxt)->_M_nxt + (long)_Var8._M_nxt[1]._M_nxt);
      LogicalType::LogicalType(&local_1d8,(LogicalType *)(_Var8._M_nxt + 5));
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->hive_types_schema,(string *)local_1f8);
      LogicalType::~LogicalType(&local_1d8);
      if ((MultiFileList *)local_1f8._0_8_ != (MultiFileList *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_);
      }
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  goto LAB_0123952c;
}

Assistant:

void MultiFileOptions::AutoDetectHiveTypesInternal(MultiFileList &files, ClientContext &context) {
	const LogicalType candidates[] = {LogicalType::DATE, LogicalType::TIMESTAMP, LogicalType::BIGINT};

	unordered_map<string, LogicalType> detected_types;
	for (const auto &file : files.Files()) {
		auto partitions = HivePartitioning::Parse(file.path);
		if (partitions.empty()) {
			return;
		}

		for (auto &part : partitions) {
			const string &name = part.first;
			if (hive_types_schema.find(name) != hive_types_schema.end()) {
				// type was explicitly provided by the user
				continue;
			}
			LogicalType detected_type = LogicalType::VARCHAR;
			Value value(part.second);
			for (auto &candidate : candidates) {
				const bool success = value.TryCastAs(context, candidate, true);
				if (success) {
					detected_type = candidate;
					break;
				}
			}
			auto entry = detected_types.find(name);
			if (entry == detected_types.end()) {
				// type was not yet detected - insert it
				detected_types.insert(make_pair(name, std::move(detected_type)));
			} else {
				// type was already detected - check if the type matches
				// if not promote to VARCHAR
				if (entry->second != detected_type) {
					entry->second = LogicalType::VARCHAR;
				}
			}
		}
	}
	for (auto &entry : detected_types) {
		hive_types_schema.insert(make_pair(entry.first, std::move(entry.second)));
	}
}